

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_sifm.cc
# Opt level: O3

vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_> *
__thiscall
hwtest::pgraph::Dvd::mthds
          (vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>
           *__return_storage_ptr__,Dvd *this)

{
  mt19937 *this_00;
  TestOptions *opt;
  uint32_t uVar1;
  undefined8 uVar2;
  SingleMthdTest *this_01;
  result_type rVar3;
  Test *pTVar4;
  MthdDmaGrobj *pMVar5;
  vector<hwtest::pgraph::SingleMthdTest*,std::allocator<hwtest::pgraph::SingleMthdTest*>> *pvVar6;
  initializer_list<hwtest::pgraph::SingleMthdTest_*> __l;
  allocator_type local_469;
  vector<hwtest::pgraph::SingleMthdTest*,std::allocator<hwtest::pgraph::SingleMthdTest*>> *local_468
  ;
  Test *local_460;
  Test *local_458;
  Test *local_450;
  Test *local_448;
  Test *local_440;
  undefined1 *local_438;
  long local_430;
  undefined1 local_428 [16];
  Test *local_418;
  long local_410;
  undefined1 local_408 [128];
  undefined1 *local_388;
  long local_380;
  undefined1 local_378 [16];
  undefined1 *local_368;
  long local_360;
  undefined1 local_358 [16];
  undefined1 *local_348;
  long local_340;
  undefined1 local_338 [16];
  undefined1 *local_328;
  long local_320;
  undefined1 local_318 [16];
  undefined1 *local_308;
  long local_300;
  undefined1 local_2f8 [16];
  undefined1 *local_2e8;
  long local_2e0;
  undefined1 local_2d8 [16];
  undefined1 *local_2c8;
  long local_2c0;
  undefined1 local_2b8 [16];
  undefined1 *local_2a8;
  long local_2a0;
  undefined1 local_298 [16];
  undefined1 *local_288;
  long local_280;
  undefined1 local_278 [16];
  undefined1 *local_268;
  long local_260;
  undefined1 local_258 [16];
  undefined1 *local_248;
  long local_240;
  undefined1 local_238 [16];
  undefined1 *local_228;
  long local_220;
  undefined1 local_218 [16];
  undefined1 *local_208;
  long local_200;
  undefined1 local_1f8 [16];
  undefined1 *local_1e8;
  long local_1e0;
  undefined1 local_1d8 [16];
  undefined1 *local_1c8;
  long local_1c0;
  undefined1 local_1b8 [16];
  undefined1 *local_1a8;
  long local_1a0;
  undefined1 local_198 [16];
  undefined1 *local_188;
  long local_180;
  undefined1 local_178 [16];
  undefined1 *local_168;
  long local_160;
  undefined1 local_158 [16];
  undefined1 *local_148;
  long local_140;
  undefined1 local_138 [16];
  string local_128;
  string local_108;
  SingleMthdTest *local_e8;
  Test *local_e0;
  Test *local_d8;
  Test *local_d0;
  MthdDmaGrobj *local_c8;
  MthdDmaGrobj *local_c0;
  Test *local_b8;
  Test *local_b0;
  Test *local_a8;
  Test *local_a0;
  Test *local_98;
  Test *local_90;
  Test *local_88;
  Test *local_80;
  Test *local_78;
  Test *local_70;
  Test *local_68;
  Test *local_60;
  Test *local_58;
  Test *local_50;
  Test *local_48;
  Test *local_40;
  Test *local_38;
  
  this_01 = (SingleMthdTest *)operator_new(0x25950);
  this_00 = &(this->super_Class).rnd;
  local_408._120_8_ = this_01;
  rVar3 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_418 = (Test *)local_408;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_418,"nop","");
  opt = &(this->super_Class).opt;
  uVar1 = (this->super_Class).cls;
  Test::Test((Test *)this_01,opt,(uint32_t)rVar3);
  (this_01->super_MthdTest).trapbit = -1;
  (this_01->super_MthdTest).super_StateTest.super_RepeatTest.super_Test._vptr_Test =
       (_func_int **)&PTR__SingleMthdTest_00356770;
  this_01->s_cls = uVar1;
  this_01->s_mthd = 0x100;
  this_01->s_stride = 4;
  this_01->s_num = 1;
  this_01->s_trapbit = -1;
  (this_01->name)._M_dataplus._M_p = (pointer)&(this_01->name).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this_01->name,local_418,(long)(local_418->rnd)._M_x + local_410 + -8);
  (this_01->super_MthdTest).super_StateTest.super_RepeatTest.super_Test._vptr_Test =
       (_func_int **)&PTR__SingleMthdTest_00356aa0;
  local_e8 = this_01;
  pTVar4 = (Test *)operator_new(0x25950);
  local_408._112_8_ = pTVar4;
  rVar3 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_148 = local_138;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"notify","");
  uVar1 = (this->super_Class).cls;
  Test::Test(pTVar4,opt,(uint32_t)rVar3);
  *(undefined4 *)(pTVar4[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar4->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00356770;
  *(uint32_t *)(pTVar4[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar4[0x1e].rnd._M_x + 0x894) = 0x104;
  *(undefined4 *)(pTVar4[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar4[0x1e].rnd._M_x + 0x89c) = 1;
  *(undefined4 *)(pTVar4[0x1e].rnd._M_x + 0x114) = 0;
  pTVar4[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar4[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar4[0x1e].rnd._M_x + 0x115),local_148,local_148 + local_140);
  pTVar4->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00356c90;
  local_e0 = pTVar4;
  pTVar4 = (Test *)operator_new(0x25950);
  local_408._104_8_ = pTVar4;
  rVar3 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_168 = local_158;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_168,"pm_trigger","");
  uVar1 = (this->super_Class).cls;
  Test::Test(pTVar4,opt,(uint32_t)rVar3);
  *(undefined4 *)(pTVar4[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar4->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00356770;
  *(uint32_t *)(pTVar4[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar4[0x1e].rnd._M_x + 0x894) = 0x140;
  *(undefined4 *)(pTVar4[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar4[0x1e].rnd._M_x + 0x89c) = 1;
  *(undefined4 *)(pTVar4[0x1e].rnd._M_x + 0x114) = 0xffffffff;
  pTVar4[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar4[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar4[0x1e].rnd._M_x + 0x115),local_168,local_168 + local_160);
  pTVar4->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00358ad0;
  local_d8 = pTVar4;
  local_440 = (Test *)operator_new(0x25950);
  rVar3 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_188 = local_178;
  local_468 = (vector<hwtest::pgraph::SingleMthdTest*,std::allocator<hwtest::pgraph::SingleMthdTest*>>
               *)__return_storage_ptr__;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_188,"dma_notify","");
  pTVar4 = local_440;
  uVar1 = (this->super_Class).cls;
  Test::Test(local_440,opt,(uint32_t)rVar3);
  *(undefined4 *)(pTVar4[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar4->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00356770;
  *(uint32_t *)(pTVar4[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar4[0x1e].rnd._M_x + 0x894) = 0x180;
  *(undefined4 *)(pTVar4[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar4[0x1e].rnd._M_x + 0x89c) = 1;
  *(undefined4 *)(pTVar4[0x1e].rnd._M_x + 0x114) = 1;
  pTVar4[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar4[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar4[0x1e].rnd._M_x + 0x115),local_188,local_188 + local_180);
  pTVar4->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00357928;
  local_d0 = pTVar4;
  pMVar5 = (MthdDmaGrobj *)operator_new(0x25960);
  local_408._96_8_ = pMVar5;
  rVar3 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"dma_ov","");
  MthdDmaGrobj::MthdDmaGrobj
            (pMVar5,opt,(uint32_t)rVar3,&local_108,2,(this->super_Class).cls,0x184,1,0);
  local_c8 = pMVar5;
  pMVar5 = (MthdDmaGrobj *)operator_new(0x25960);
  local_408._88_8_ = pMVar5;
  rVar3 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"dma_src","");
  MthdDmaGrobj::MthdDmaGrobj
            (pMVar5,opt,(uint32_t)rVar3,&local_128,3,(this->super_Class).cls,0x188,0,0);
  local_c0 = pMVar5;
  local_448 = (Test *)operator_new(0x25958);
  rVar3 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_1a8 = local_198;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"dma_surf","");
  pTVar4 = local_448;
  uVar1 = (this->super_Class).cls;
  Test::Test(local_448,opt,(uint32_t)rVar3);
  *(undefined4 *)(pTVar4[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar4->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00356770;
  *(uint32_t *)(pTVar4[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar4[0x1e].rnd._M_x + 0x894) = 0x18c;
  *(undefined4 *)(pTVar4[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar4[0x1e].rnd._M_x + 0x89c) = 1;
  *(undefined4 *)(pTVar4[0x1e].rnd._M_x + 0x114) = 4;
  pTVar4[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar4[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar4[0x1e].rnd._M_x + 0x115),local_1a8,local_1a8 + local_1a0);
  pTVar4->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00359c70;
  *(undefined4 *)(pTVar4[0x1e].rnd._M_x + 0x119) = 4;
  *(uint *)((long)pTVar4[0x1e].rnd._M_x + 0x8cc) = (uVar1 == 0x88) + 1;
  local_b8 = pTVar4;
  pTVar4 = (Test *)operator_new(0x25950);
  local_408._80_8_ = pTVar4;
  rVar3 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_1c8 = local_1b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c8,"xy","");
  uVar1 = (this->super_Class).cls;
  Test::Test(pTVar4,opt,(uint32_t)rVar3);
  *(undefined4 *)(pTVar4[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar4->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00356770;
  *(uint32_t *)(pTVar4[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar4[0x1e].rnd._M_x + 0x894) = 0x300;
  *(undefined4 *)(pTVar4[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar4[0x1e].rnd._M_x + 0x89c) = 1;
  *(undefined4 *)(pTVar4[0x1e].rnd._M_x + 0x114) = 5;
  pTVar4[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar4[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar4[0x1e].rnd._M_x + 0x115),local_1c8,local_1c8 + local_1c0);
  pTVar4->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_0035d5d0;
  local_b0 = pTVar4;
  pTVar4 = (Test *)operator_new(0x25950);
  local_408._72_8_ = pTVar4;
  rVar3 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_1e8 = local_1d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e8,"rect","");
  uVar1 = (this->super_Class).cls;
  Test::Test(pTVar4,opt,(uint32_t)rVar3);
  *(undefined4 *)(pTVar4[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar4->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00356770;
  *(uint32_t *)(pTVar4[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar4[0x1e].rnd._M_x + 0x894) = 0x304;
  *(undefined4 *)(pTVar4[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar4[0x1e].rnd._M_x + 0x89c) = 1;
  *(undefined4 *)(pTVar4[0x1e].rnd._M_x + 0x114) = 6;
  pTVar4[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar4[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar4[0x1e].rnd._M_x + 0x115),local_1e8,local_1e8 + local_1e0);
  pTVar4->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_0035d6c8;
  local_a8 = pTVar4;
  pTVar4 = (Test *)operator_new(0x25950);
  local_408._64_8_ = pTVar4;
  rVar3 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_208 = local_1f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_208,"surf_format","");
  uVar1 = (this->super_Class).cls;
  Test::Test(pTVar4,opt,(uint32_t)rVar3);
  *(undefined4 *)(pTVar4[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar4->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00356770;
  *(uint32_t *)(pTVar4[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar4[0x1e].rnd._M_x + 0x894) = 0x308;
  *(undefined4 *)(pTVar4[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar4[0x1e].rnd._M_x + 0x89c) = 1;
  *(undefined4 *)(pTVar4[0x1e].rnd._M_x + 0x114) = 7;
  pTVar4[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar4[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar4[0x1e].rnd._M_x + 0x115),local_208,local_208 + local_200);
  pTVar4->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_0035e268;
  local_a0 = pTVar4;
  local_450 = (Test *)operator_new(0x25958);
  rVar3 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_228 = local_218;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_228,"surf_offset","");
  pTVar4 = local_450;
  uVar1 = (this->super_Class).cls;
  Test::Test(local_450,opt,(uint32_t)rVar3);
  *(undefined4 *)(pTVar4[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar4->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00356770;
  *(uint32_t *)(pTVar4[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar4[0x1e].rnd._M_x + 0x894) = 0x30c;
  *(undefined4 *)(pTVar4[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar4[0x1e].rnd._M_x + 0x89c) = 1;
  *(undefined4 *)(pTVar4[0x1e].rnd._M_x + 0x114) = 8;
  pTVar4[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar4[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar4[0x1e].rnd._M_x + 0x115),local_228,local_228 + local_220);
  pTVar4->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00359d68;
  *(undefined4 *)(pTVar4[0x1e].rnd._M_x + 0x119) = 4;
  *(uint *)((long)pTVar4[0x1e].rnd._M_x + 0x8cc) = (uVar1 == 0x88) + 1;
  local_98 = pTVar4;
  pTVar4 = (Test *)operator_new(0x25958);
  local_408._56_8_ = pTVar4;
  rVar3 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_248 = local_238;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_248,"src.dudx","");
  uVar1 = (this->super_Class).cls;
  Test::Test(pTVar4,opt,(uint32_t)rVar3);
  *(undefined4 *)(pTVar4[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar4->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00356770;
  *(uint32_t *)(pTVar4[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar4[0x1e].rnd._M_x + 0x894) = 0x310;
  *(undefined4 *)(pTVar4[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar4[0x1e].rnd._M_x + 0x89c) = 1;
  *(undefined4 *)(pTVar4[0x1e].rnd._M_x + 0x114) = 9;
  pTVar4[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar4[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar4[0x1e].rnd._M_x + 0x115),local_248,local_248 + local_240);
  pTVar4->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_0035d7c0;
  *(undefined4 *)(pTVar4[0x1e].rnd._M_x + 0x119) = 0;
  local_90 = pTVar4;
  pTVar4 = (Test *)operator_new(0x25958);
  local_408._48_8_ = pTVar4;
  rVar3 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_268 = local_258;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,"src.dvdy","");
  uVar1 = (this->super_Class).cls;
  Test::Test(pTVar4,opt,(uint32_t)rVar3);
  *(undefined4 *)(pTVar4[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar4->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00356770;
  *(uint32_t *)(pTVar4[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar4[0x1e].rnd._M_x + 0x894) = 0x314;
  *(undefined4 *)(pTVar4[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar4[0x1e].rnd._M_x + 0x89c) = 1;
  *(undefined4 *)(pTVar4[0x1e].rnd._M_x + 0x114) = 10;
  pTVar4[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar4[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar4[0x1e].rnd._M_x + 0x115),local_268,local_268 + local_260);
  pTVar4->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_0035d8b8;
  *(undefined4 *)(pTVar4[0x1e].rnd._M_x + 0x119) = 0;
  local_88 = pTVar4;
  pTVar4 = (Test *)operator_new(0x25958);
  local_408._40_8_ = pTVar4;
  rVar3 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_288 = local_278;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_288,"src.size","");
  uVar1 = (this->super_Class).cls;
  Test::Test(pTVar4,opt,(uint32_t)rVar3);
  *(undefined4 *)(pTVar4[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar4->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00356770;
  *(uint32_t *)(pTVar4[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar4[0x1e].rnd._M_x + 0x894) = 0x318;
  *(undefined4 *)(pTVar4[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar4[0x1e].rnd._M_x + 0x89c) = 1;
  *(undefined4 *)(pTVar4[0x1e].rnd._M_x + 0x114) = 0xb;
  pTVar4[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar4[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar4[0x1e].rnd._M_x + 0x115),local_288,local_288 + local_280);
  pTVar4->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_0035d9b0;
  *(undefined4 *)(pTVar4[0x1e].rnd._M_x + 0x119) = 0;
  local_80 = pTVar4;
  pTVar4 = (Test *)operator_new(0x25958);
  local_408._32_8_ = pTVar4;
  rVar3 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_2a8 = local_298;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a8,"src.format","");
  uVar1 = (this->super_Class).cls;
  Test::Test(pTVar4,opt,(uint32_t)rVar3);
  *(undefined4 *)(pTVar4[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar4->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00356770;
  *(uint32_t *)(pTVar4[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar4[0x1e].rnd._M_x + 0x894) = 0x31c;
  *(undefined4 *)(pTVar4[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar4[0x1e].rnd._M_x + 0x89c) = 1;
  *(undefined4 *)(pTVar4[0x1e].rnd._M_x + 0x114) = 0xc;
  pTVar4[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar4[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar4[0x1e].rnd._M_x + 0x115),local_2a8,local_2a8 + local_2a0);
  pTVar4->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_0035e360;
  *(undefined4 *)(pTVar4[0x1e].rnd._M_x + 0x119) = 0;
  local_78 = pTVar4;
  pTVar4 = (Test *)operator_new(0x25958);
  local_408._24_8_ = pTVar4;
  rVar3 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_2c8 = local_2b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2c8,"src.offset","");
  uVar1 = (this->super_Class).cls;
  Test::Test(pTVar4,opt,(uint32_t)rVar3);
  *(undefined4 *)(pTVar4[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar4->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00356770;
  *(uint32_t *)(pTVar4[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar4[0x1e].rnd._M_x + 0x894) = 800;
  *(undefined4 *)(pTVar4[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar4[0x1e].rnd._M_x + 0x89c) = 1;
  *(undefined4 *)(pTVar4[0x1e].rnd._M_x + 0x114) = 0xd;
  pTVar4[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar4[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar4[0x1e].rnd._M_x + 0x115),local_2c8,local_2c8 + local_2c0);
  pTVar4->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_0035dba0;
  *(undefined4 *)(pTVar4[0x1e].rnd._M_x + 0x119) = 0;
  local_70 = pTVar4;
  local_458 = (Test *)operator_new(0x25958);
  rVar3 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_2e8 = local_2d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e8,"src.pos","");
  pTVar4 = local_458;
  uVar1 = (this->super_Class).cls;
  Test::Test(local_458,opt,(uint32_t)rVar3);
  *(undefined4 *)(pTVar4[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar4->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00356770;
  *(uint32_t *)(pTVar4[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar4[0x1e].rnd._M_x + 0x894) = 0x324;
  *(undefined4 *)(pTVar4[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar4[0x1e].rnd._M_x + 0x89c) = 1;
  *(undefined4 *)(pTVar4[0x1e].rnd._M_x + 0x114) = 0xe;
  pTVar4[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar4[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar4[0x1e].rnd._M_x + 0x115),local_2e8,local_2e8 + local_2e0);
  pTVar4->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_0035dc98;
  *(undefined4 *)(pTVar4[0x1e].rnd._M_x + 0x119) = 0;
  *(undefined1 *)((long)pTVar4[0x1e].rnd._M_x + 0x8cc) = 0;
  local_68 = pTVar4;
  local_460 = (Test *)operator_new(0x25958);
  rVar3 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_308 = local_2f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_308,"ov.dudx","");
  pTVar4 = local_460;
  uVar1 = (this->super_Class).cls;
  Test::Test(local_460,opt,(uint32_t)rVar3);
  *(undefined4 *)(pTVar4[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar4->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00356770;
  *(uint32_t *)(pTVar4[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar4[0x1e].rnd._M_x + 0x894) = 0x328;
  *(undefined4 *)(pTVar4[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar4[0x1e].rnd._M_x + 0x89c) = 1;
  *(undefined4 *)(pTVar4[0x1e].rnd._M_x + 0x114) = 0xf;
  pTVar4[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar4[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar4[0x1e].rnd._M_x + 0x115),local_308,local_308 + local_300);
  pTVar4->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_0035d7c0;
  *(undefined4 *)(pTVar4[0x1e].rnd._M_x + 0x119) = 1;
  local_60 = pTVar4;
  pTVar4 = (Test *)operator_new(0x25958);
  local_408._16_8_ = pTVar4;
  rVar3 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_328 = local_318;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_328,"ov.dvdy","");
  uVar1 = (this->super_Class).cls;
  Test::Test(pTVar4,opt,(uint32_t)rVar3);
  *(undefined4 *)(pTVar4[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar4->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00356770;
  *(uint32_t *)(pTVar4[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar4[0x1e].rnd._M_x + 0x894) = 0x32c;
  *(undefined4 *)(pTVar4[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar4[0x1e].rnd._M_x + 0x89c) = 1;
  *(undefined4 *)(pTVar4[0x1e].rnd._M_x + 0x114) = 0x10;
  pTVar4[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar4[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar4[0x1e].rnd._M_x + 0x115),local_328,local_328 + local_320);
  pTVar4->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_0035d8b8;
  *(undefined4 *)(pTVar4[0x1e].rnd._M_x + 0x119) = 1;
  local_58 = pTVar4;
  pTVar4 = (Test *)operator_new(0x25958);
  rVar3 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_348 = local_338;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_348,"ov.size","");
  uVar1 = (this->super_Class).cls;
  Test::Test(pTVar4,opt,(uint32_t)rVar3);
  *(undefined4 *)(pTVar4[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar4->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00356770;
  *(uint32_t *)(pTVar4[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar4[0x1e].rnd._M_x + 0x894) = 0x330;
  *(undefined4 *)(pTVar4[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar4[0x1e].rnd._M_x + 0x89c) = 1;
  *(undefined4 *)(pTVar4[0x1e].rnd._M_x + 0x114) = 0x11;
  pTVar4[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar4[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar4[0x1e].rnd._M_x + 0x115),local_348,local_348 + local_340);
  pTVar4->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_0035d9b0;
  *(undefined4 *)(pTVar4[0x1e].rnd._M_x + 0x119) = 1;
  local_50 = pTVar4;
  pTVar4 = (Test *)operator_new(0x25958);
  rVar3 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_368 = local_358;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_368,"ov.format","");
  uVar1 = (this->super_Class).cls;
  Test::Test(pTVar4,opt,(uint32_t)rVar3);
  *(undefined4 *)(pTVar4[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar4->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00356770;
  *(uint32_t *)(pTVar4[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar4[0x1e].rnd._M_x + 0x894) = 0x334;
  *(undefined4 *)(pTVar4[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar4[0x1e].rnd._M_x + 0x89c) = 1;
  *(undefined4 *)(pTVar4[0x1e].rnd._M_x + 0x114) = 0x12;
  pTVar4[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar4[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar4[0x1e].rnd._M_x + 0x115),local_368,local_368 + local_360);
  pTVar4->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_0035e360;
  *(undefined4 *)(pTVar4[0x1e].rnd._M_x + 0x119) = 1;
  local_48 = pTVar4;
  pTVar4 = (Test *)operator_new(0x25958);
  rVar3 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_388 = local_378;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_388,"ov.offset","");
  uVar1 = (this->super_Class).cls;
  Test::Test(pTVar4,opt,(uint32_t)rVar3);
  *(undefined4 *)(pTVar4[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar4->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00356770;
  *(uint32_t *)(pTVar4[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar4[0x1e].rnd._M_x + 0x894) = 0x338;
  *(undefined4 *)(pTVar4[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar4[0x1e].rnd._M_x + 0x89c) = 1;
  *(undefined4 *)(pTVar4[0x1e].rnd._M_x + 0x114) = 0x13;
  pTVar4[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar4[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar4[0x1e].rnd._M_x + 0x115),local_388,local_388 + local_380);
  pTVar4->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_0035dba0;
  *(undefined4 *)(pTVar4[0x1e].rnd._M_x + 0x119) = 1;
  local_40 = pTVar4;
  pTVar4 = (Test *)operator_new(0x25958);
  rVar3 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_438 = local_428;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_438,"ov.pos","");
  uVar1 = (this->super_Class).cls;
  Test::Test(pTVar4,opt,(uint32_t)rVar3);
  *(undefined4 *)(pTVar4[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar4->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00356770;
  *(uint32_t *)(pTVar4[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar4[0x1e].rnd._M_x + 0x894) = 0x33c;
  *(undefined4 *)(pTVar4[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar4[0x1e].rnd._M_x + 0x89c) = 1;
  *(undefined4 *)(pTVar4[0x1e].rnd._M_x + 0x114) = 0x14;
  pTVar4[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar4[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar4[0x1e].rnd._M_x + 0x115),local_438,local_438 + local_430);
  pvVar6 = local_468;
  pTVar4->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_0035dc98;
  *(undefined4 *)(pTVar4[0x1e].rnd._M_x + 0x119) = 1;
  *(undefined1 *)((long)pTVar4[0x1e].rnd._M_x + 0x8cc) = 1;
  __l._M_len = 0x17;
  __l._M_array = &local_e8;
  local_38 = pTVar4;
  std::vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>::
  vector((vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>
          *)local_468,__l,&local_469);
  if (local_438 != local_428) {
    operator_delete(local_438);
  }
  if (local_388 != local_378) {
    operator_delete(local_388);
  }
  if (local_368 != local_358) {
    operator_delete(local_368);
  }
  if (local_348 != local_338) {
    operator_delete(local_348);
  }
  if (local_328 != local_318) {
    operator_delete(local_328);
  }
  if (local_308 != local_2f8) {
    operator_delete(local_308);
  }
  if (local_2e8 != local_2d8) {
    operator_delete(local_2e8);
  }
  if (local_2c8 != local_2b8) {
    operator_delete(local_2c8);
  }
  if (local_2a8 != local_298) {
    operator_delete(local_2a8);
  }
  if (local_288 != local_278) {
    operator_delete(local_288);
  }
  if (local_268 != local_258) {
    operator_delete(local_268);
  }
  if (local_248 != local_238) {
    operator_delete(local_248);
  }
  if (local_228 != local_218) {
    operator_delete(local_228);
  }
  if (local_208 != local_1f8) {
    operator_delete(local_208);
  }
  if (local_1e8 != local_1d8) {
    operator_delete(local_1e8);
  }
  if (local_1c8 != local_1b8) {
    operator_delete(local_1c8);
  }
  if (local_1a8 != local_198) {
    operator_delete(local_1a8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_dataplus._M_p != &local_128.field_2) {
    operator_delete(local_128._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != &local_108.field_2) {
    operator_delete(local_108._M_dataplus._M_p);
  }
  if (local_188 != local_178) {
    operator_delete(local_188);
  }
  if (local_168 != local_158) {
    operator_delete(local_168);
  }
  if (local_148 != local_138) {
    operator_delete(local_148);
  }
  if (local_418 != (Test *)local_408) {
    operator_delete(local_418);
  }
  if ((char)(this->super_Class).cls == -0x78) {
    uVar2 = *(undefined8 *)pvVar6;
    pTVar4 = (Test *)operator_new(0x25950);
    rVar3 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(this_00);
    local_e8 = (SingleMthdTest *)&stack0xffffffffffffff28;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"sync","");
    uVar1 = (this->super_Class).cls;
    Test::Test(pTVar4,opt,(uint32_t)rVar3);
    *(undefined4 *)(pTVar4[0x1e].rnd._M_x + 0x106) = 0xffffffff;
    pTVar4->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00356770;
    *(uint32_t *)(pTVar4[0x1e].rnd._M_x + 0x112) = uVar1;
    *(undefined4 *)((long)pTVar4[0x1e].rnd._M_x + 0x894) = 0x108;
    *(undefined4 *)(pTVar4[0x1e].rnd._M_x + 0x113) = 4;
    *(undefined4 *)((long)pTVar4[0x1e].rnd._M_x + 0x89c) = 1;
    *(undefined4 *)(pTVar4[0x1e].rnd._M_x + 0x114) = 0xffffffff;
    pTVar4[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar4[0x1e].rnd._M_x + 0x117);
    std::__cxx11::string::_M_construct<char*>
              ((string *)(pTVar4[0x1e].rnd._M_x + 0x115),local_e8,
               (long)(local_e8->super_MthdTest).super_StateTest.super_RepeatTest.super_Test.rnd._M_x
               + (long)(&local_e0->rnd + -1) + 0x1378U);
    pTVar4->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00356b98;
    local_418 = pTVar4;
    std::vector<hwtest::pgraph::SingleMthdTest*,std::allocator<hwtest::pgraph::SingleMthdTest*>>::
    _M_range_insert<hwtest::pgraph::SingleMthdTest*const*>(local_468,uVar2,&local_418);
    pvVar6 = local_468;
    if (local_e8 != (SingleMthdTest *)&stack0xffffffffffffff28) {
      operator_delete(local_e8);
      pvVar6 = local_468;
    }
  }
  return (vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>
          *)pvVar6;
}

Assistant:

std::vector<SingleMthdTest *> Dvd::mthds() {
	std::vector<SingleMthdTest *> res = {
		new MthdNop(opt, rnd(), "nop", -1, cls, 0x100),
		new MthdNotify(opt, rnd(), "notify", 0, cls, 0x104),
		new MthdPmTrigger(opt, rnd(), "pm_trigger", -1, cls, 0x140),
		new MthdDmaNotify(opt, rnd(), "dma_notify", 1, cls, 0x180),
		new MthdDmaGrobj(opt, rnd(), "dma_ov", 2, cls, 0x184, 1, DMA_R),
		new MthdDmaGrobj(opt, rnd(), "dma_src", 3, cls, 0x188, 0, DMA_R),
		new MthdDmaSurf(opt, rnd(), "dma_surf", 4, cls, 0x18c, 4, cls == 0x88 ? SURF_NV10 : SURF_NV4),
		new MthdSifmXy(opt, rnd(), "xy", 5, cls, 0x300),
		new MthdSifmRect(opt, rnd(), "rect", 6, cls, 0x304),
		new MthdSurfDvdFormat(opt, rnd(), "surf_format", 7, cls, 0x308),
		new MthdSurfOffset(opt, rnd(), "surf_offset", 8, cls, 0x30c, 4, cls == 0x88 ? SURF_NV10 : SURF_NV4),
		new MthdSifmDuDx(opt, rnd(), "src.dudx", 9, cls, 0x310, 0),
		new MthdSifmDvDy(opt, rnd(), "src.dvdy", 10, cls, 0x314, 0),
		new MthdSifmSrcSize(opt, rnd(), "src.size", 11, cls, 0x318, 0),
		new MthdDvdSrcFormat(opt, rnd(), "src.format", 12, cls, 0x31c, 0),
		new MthdSifmOffset(opt, rnd(), "src.offset", 13, cls, 0x320, 0),
		new MthdSifmSrcPos(opt, rnd(), "src.pos", 14, cls, 0x324, 0, false),
		new MthdSifmDuDx(opt, rnd(), "ov.dudx", 15, cls, 0x328, 1),
		new MthdSifmDvDy(opt, rnd(), "ov.dvdy", 16, cls, 0x32c, 1),
		new MthdSifmSrcSize(opt, rnd(), "ov.size", 17, cls, 0x330, 1),
		new MthdDvdSrcFormat(opt, rnd(), "ov.format", 18, cls, 0x334, 1),
		new MthdSifmOffset(opt, rnd(), "ov.offset", 19, cls, 0x338, 1),
		new MthdSifmSrcPos(opt, rnd(), "ov.pos", 20, cls, 0x33c, 1, true),
	};
	if ((cls & 0xff) == 0x88) {
		res.insert(res.begin(), {
			new MthdSync(opt, rnd(), "sync", -1, cls, 0x108),
		});
	}
	return res;
}